

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

vector<LogCategory,_std::allocator<LogCategory>_> * __thiscall
BCLog::Logger::LogCategoriesList
          (vector<LogCategory,_std::allocator<LogCategory>_> *__return_storage_ptr__,Logger *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  LogCategory local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<LogCategory,_std::allocator<LogCategory>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LogCategory,_std::allocator<LogCategory>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LogCategory,_std::allocator<LogCategory>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<LogCategory,_std::allocator<LogCategory>_>::reserve
            (__return_storage_ptr__,
             LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((_Rb_tree_header *)
      LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_60.category.field_2;
    p_Var2 = LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_60.category._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,*(long *)(p_Var2 + 1),
                 (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
      local_60.active =
           (*(ulong *)(p_Var2 + 2) & (this->m_categories).super___atomic_base<unsigned_long>._M_i)
           != 0;
      std::vector<LogCategory,_std::allocator<LogCategory>_>::emplace_back<LogCategory>
                (__return_storage_ptr__,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.category._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.category._M_dataplus._M_p,
                        local_60.category.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 !=
             &LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<LogCategory> BCLog::Logger::LogCategoriesList() const
{
    std::vector<LogCategory> ret;
    ret.reserve(LOG_CATEGORIES_BY_STR.size());
    for (const auto& [category, flag] : LOG_CATEGORIES_BY_STR) {
        ret.push_back(LogCategory{.category = category, .active = WillLogCategory(flag)});
    }
    return ret;
}